

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::AdvancedUnsizedArrayLength<1>::Run(AdvancedUnsizedArrayLength<1> *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  GLuint GVar5;
  ostream *poVar6;
  uint *puVar7;
  long lVar8;
  ulong uVar9;
  int i;
  long lVar10;
  int *piVar11;
  long lStack_240;
  allocator<char> local_229;
  string expr;
  string decl;
  string glsl_fs;
  string glsl_vs;
  vector<int,_std::allocator<int>_> data;
  
  bVar4 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,0,4);
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&data);
    std::operator<<((ostream *)&data,
                    "\nvoid main() {\n  gl_Position = vec4(0,0,0,1);\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif"
                   );
    std::operator<<((ostream *)&data,"\n}");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&data);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decl,
               "\nlayout(std430, binding = 0) readonly buffer Input0 {\n  uint g_input0[];\n};\nlayout(std430, binding = 1) readonly buffer Input23 {\n  float data[];\n} g_input23[2];\nlayout(std430, binding = 3) buffer Output {\n  int g_length2;\n  int g_length[];\n};"
               ,(allocator<char> *)&expr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&expr,
               "\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input23[0].data.length();\n  g_length[2] = g_input23[1].data.length();\n  g_length2 = g_length.length();"
               ,&local_229);
    poVar6 = std::operator<<((ostream *)&data,"\nlayout(location = 0) out vec4 o_color;");
    poVar6 = std::operator<<(poVar6,(string *)&decl);
    poVar6 = std::operator<<(poVar6,"\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);");
    std::operator<<(poVar6,(string *)&expr);
    std::operator<<((ostream *)&data,"\n}");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&expr);
    std::__cxx11::string::~string((string *)&decl);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&data);
    GVar5 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&glsl_vs,&glsl_fs);
    this->m_program = GVar5;
    std::__cxx11::string::~string((string *)&glsl_fs);
    std::__cxx11::string::~string((string *)&glsl_vs);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar4 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar4) {
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
      decl._M_dataplus._M_p._0_4_ = 0x29;
      std::vector<int,_std::allocator<int>_>::vector
                (&data,10000,(value_type_conflict1 *)&decl,(allocator_type *)&expr);
      piVar11 = &DAT_0175ce70;
      for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
        glu::CallLogWrapper::glBindBufferBase
                  (this_00,0x90d2,(GLuint)lVar10,this->m_storage_buffer[lVar10]);
        glu::CallLogWrapper::glBufferData
                  (this_00,0x90d2,(long)(*piVar11 << 2),
                   data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,0x88ea);
        piVar11 = piVar11 + 1;
      }
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
      puVar7 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x14,1);
      if (puVar7 != (uint *)0x0) {
        uVar9 = 1;
        lVar10 = 0;
        do {
          lVar8 = 0;
          do {
            if (lVar10 + lVar8 == 3) {
              if (*puVar7 != 4) {
                uVar9 = 0;
                anon_unknown_0::Output("Array %d length is %d should be %d.\n",3,(ulong)*puVar7,4);
              }
              glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
              lStack_240 = (uVar9 | 0xfffffffffffffffe) + 1;
              goto LAB_00c7cb48;
            }
            lVar2 = lVar8 + 1;
            lVar3 = lVar8 + lVar10;
            lVar8 = lVar8 + 1;
          } while (puVar7[lVar10 + lVar2] == (&DAT_0175ce70)[lVar3]);
          iVar1 = (int)lVar10;
          lVar10 = lVar10 + lVar8;
          anon_unknown_0::Output
                    ("Array %d length is %d should be %d.\n",(ulong)((iVar1 + (int)lVar8) - 1));
          uVar9 = 0;
        } while( true );
      }
      lStack_240 = -1;
LAB_00c7cb48:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&data.super__Vector_base<int,_std::allocator<int>_>);
    }
    else {
      lStack_240 = -1;
    }
  }
  else {
    lStack_240 = 0x10;
  }
  return lStack_240;
}

Assistant:

virtual long Run()
	{
		const int kSize = 10000;
		const int kBufs = 4;
		if ((stage == vertex && !IsVSFSAvailable(kBufs, 0)) || (stage == fragment && !IsVSFSAvailable(0, kBufs)))
			return NOT_SUPPORTED;
		if (stage == vertex)
		{
			std::string glsl_vs = BuildShader();
			std::string glsl_fs = BuildShaderPT(fragment);
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else if (stage == fragment)
		{
			std::string glsl_vs = BuildShaderPT(vertex);
			std::string glsl_fs = BuildShader();
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else
		{ // compute
			std::string glsl_cs = BuildShader();
			m_program			= CreateProgramCS(glsl_cs);
		}
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;
		glUseProgram(m_program);

		glGenBuffers(kBufs, m_storage_buffer);
		int				 sizes[kBufs] = { 7, 3, 4, 5 };
		std::vector<int> data(kSize, 41);
		for (int i = 0; i < kBufs; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizes[i] * 4, &data[0], GL_DYNAMIC_COPY);
		}

		if (stage != compute)
		{
			glGenVertexArrays(1, &m_vertex_array);
			glBindVertexArray(m_vertex_array);
			glDrawArrays(GL_POINTS, 0, 1);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
		int* dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizes[kBufs - 1], GL_MAP_READ_BIT);
		if (!dataout)
			return ERROR;
		bool status = true;
		for (int i = 0; i < kBufs - 1; ++i)
			if (dataout[i + 1] != sizes[i])
			{
				Output("Array %d length is %d should be %d.\n", i, dataout[i + 1], sizes[i]);
				status = false;
			}
		if (dataout[0] != sizes[kBufs - 1] - 1)
		{
			Output("Array %d length is %d should be %d.\n", kBufs - 1, dataout[0], sizes[kBufs - 1] - 1);
			status = false;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		if (!status)
			return ERROR;

		return NO_ERROR;
	}